

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  EnumDescriptor *pEVar1;
  char (*in_stack_fffffffffffffec8) [3];
  undefined1 local_130 [16];
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  local_60[0] = NullSafeStringView("Enum type \"");
  pEVar1 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  local_90.piece_._M_str = (pEVar1->all_names_).payload_;
  local_90.piece_._M_len = (size_t)*(ushort *)(local_90.piece_._M_str + 2);
  local_90.piece_._M_str = local_90.piece_._M_str + ~local_90.piece_._M_len;
  local_c0.piece_ = NullSafeStringView("\" has no value named \"");
  local_f0.piece_._M_str = (char *)**(undefined8 **)(this + 8);
  local_f0.piece_._M_len = (*(undefined8 **)(this + 8))[1];
  local_120.piece_ = NullSafeStringView("\" for option \"");
  local_130._0_8_ = ZEXT28(*(ushort *)(*(long *)(**(long **)this + 8) + 2));
  local_130._8_8_ = ~local_130._0_8_ + *(long *)(**(long **)this + 8);
  StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
            (__return_storage_ptr__,(lts_20250127 *)local_60,&local_90,&local_c0,&local_f0,
             &local_120,(AlphaNum *)local_130,
             (basic_string_view<char,_std::char_traits<char>_> *)0x2d57d3,in_stack_fffffffffffffec8)
  ;
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}